

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::ProcessBlock
          (PeerManagerImpl *this,CNode *node,shared_ptr<const_CBlock> *block,bool force_processing,
          bool min_pow_checked)

{
  long lVar1;
  byte bVar2;
  byte in_CL;
  byte bVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDX;
  map<uint256,_std::pair<long,_bool>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
  *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  bool *unaff_retaddr;
  bool in_stack_0000000e;
  bool in_stack_0000000f;
  shared_ptr<const_CBlock> *in_stack_00000010;
  ChainstateManager *in_stack_00000018;
  bool new_block;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock74;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock73;
  __shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff28;
  map<uint256,_std::pair<long,_bool>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
  *__x;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_CL & 1;
  bVar2 = in_R8B & 1;
  ChainstateManager::ProcessNewBlock
            (in_stack_00000018,in_stack_00000010,in_stack_0000000f,in_stack_0000000e,unaff_retaddr);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RDX,(AnnotatedMixin<std::recursive_mutex> *)
                    CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff60)),
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             SUB41((uint)in_stack_ffffffffffffff48 >> 0x18,0));
  __x = in_RDI + 0xf;
  std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_stack_ffffffffffffff28);
  CBlockHeader::GetHash
            ((CBlockHeader *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::
  map<uint256,_std::pair<long,_bool>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
  ::erase(in_RDI,(key_type *)__x);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessBlock(CNode& node, const std::shared_ptr<const CBlock>& block, bool force_processing, bool min_pow_checked)
{
    bool new_block{false};
    m_chainman.ProcessNewBlock(block, force_processing, min_pow_checked, &new_block);
    if (new_block) {
        node.m_last_block_time = GetTime<std::chrono::seconds>();
        // In case this block came from a different peer than we requested
        // from, we can erase the block request now anyway (as we just stored
        // this block to disk).
        LOCK(cs_main);
        RemoveBlockRequest(block->GetHash(), std::nullopt);
    } else {
        LOCK(cs_main);
        mapBlockSource.erase(block->GetHash());
    }
}